

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TType::coopMatParameterOK(TType *this,TType *right)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool local_37;
  bool local_36;
  bool local_29;
  TType *right_local;
  TType *this_local;
  
  bVar1 = isCoopMatNV(this);
  if (bVar1) {
    bVar1 = isCoopMatNV(right);
    local_29 = false;
    if (bVar1) {
      iVar2 = (*this->_vptr_TType[7])();
      iVar3 = (*right->_vptr_TType[7])();
      local_29 = false;
      if ((iVar2 == iVar3) && (local_29 = false, this->typeParameters == (TTypeParameters *)0x0)) {
        local_29 = right->typeParameters != (TTypeParameters *)0x0;
      }
    }
    return local_29;
  }
  bVar1 = isCoopMatKHR(this);
  if ((bVar1) && (bVar1 = isCoopMatKHR(right), bVar1)) {
    iVar2 = (*this->_vptr_TType[7])();
    iVar3 = (*right->_vptr_TType[7])();
    if (((iVar2 != iVar3) && (iVar2 = (*this->_vptr_TType[7])(), iVar2 != 0x15)) &&
       (iVar2 = (*right->_vptr_TType[7])(), iVar2 != 0x15)) {
      return false;
    }
    if ((this->typeParameters != (TTypeParameters *)0x0) ||
       (local_36 = true, right->typeParameters == (TTypeParameters *)0x0)) {
      local_37 = false;
      if (this->typeParameters != (TTypeParameters *)0x0) {
        local_37 = right->typeParameters == (TTypeParameters *)0x0;
      }
      local_36 = local_37;
    }
    return local_36;
  }
  return false;
}

Assistant:

bool coopMatParameterOK(const TType& right) const
    {
        if (isCoopMatNV()) {
            return right.isCoopMatNV() && (getBasicType() == right.getBasicType()) && typeParameters == nullptr &&
                   right.typeParameters != nullptr;
        }
        if (isCoopMatKHR() && right.isCoopMatKHR()) {
            return ((getBasicType() == right.getBasicType()) || (getBasicType() == EbtCoopmat) ||
                    (right.getBasicType() == EbtCoopmat)) &&
                   ((typeParameters == nullptr && right.typeParameters != nullptr) ||
                    (typeParameters != nullptr && right.typeParameters == nullptr));
        }
        return false;
    }